

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.cpp
# Opt level: O1

GenericResponseSentHandler * __thiscall
anon_unknown.dwarf_338ae6d::Impl::EventHandlers::responseSent
          (GenericResponseSentHandler *__return_storage_ptr__,EventHandlers *this,TypeInfo *typeinfo
          )

{
  ulong uVar1;
  ulong uVar2;
  _Hash_node_base *p_Var3;
  __node_base_ptr p_Var4;
  __node_base_ptr p_Var5;
  __hash_code __code;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_30;
  
  local_30._M_device = &this->responseSentMutex;
  local_30._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_30);
  local_30._M_owns = true;
  uVar1 = (this->responseSentMap)._M_h._M_bucket_count;
  uVar2 = (ulong)typeinfo % uVar1;
  p_Var4 = (this->responseSentMap)._M_h._M_buckets[uVar2];
  p_Var5 = (__node_base_ptr)0x0;
  if ((p_Var4 != (__node_base_ptr)0x0) &&
     (p_Var3 = p_Var4->_M_nxt, p_Var5 = p_Var4,
     p_Var4->_M_nxt[1]._M_nxt != (_Hash_node_base *)typeinfo)) {
    while (p_Var4 = p_Var3, p_Var3 = p_Var4->_M_nxt, p_Var3 != (_Hash_node_base *)0x0) {
      p_Var5 = (__node_base_ptr)0x0;
      if (((ulong)p_Var3[1]._M_nxt % uVar1 != uVar2) ||
         (p_Var5 = p_Var4, p_Var3[1]._M_nxt == (_Hash_node_base *)typeinfo)) goto LAB_00875016;
    }
    p_Var5 = (__node_base_ptr)0x0;
  }
LAB_00875016:
  if (p_Var5 == (__node_base_ptr)0x0) {
    p_Var3 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var3 = p_Var5->_M_nxt;
  }
  if (p_Var3 == (_Hash_node_base *)0x0) {
    (__return_storage_ptr__->super__Function_base)._M_manager = (_Manager_type)0x0;
    __return_storage_ptr__->_M_invoker = (_Invoker_type)0x0;
    *(undefined8 *)&(__return_storage_ptr__->super__Function_base)._M_functor = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = 0;
  }
  else {
    std::function<void_(const_void_*,_const_dap::Error_*)>::function
              (__return_storage_ptr__,
               (function<void_(const_void_*,_const_dap::Error_*)> *)(p_Var3 + 2));
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_30);
  return __return_storage_ptr__;
}

Assistant:

GenericResponseSentHandler responseSent(const dap::TypeInfo* typeinfo) {
      std::unique_lock<std::mutex> lock(responseSentMutex);
      auto it = responseSentMap.find(typeinfo);
      return (it != responseSentMap.end()) ? it->second
                                           : decltype(it->second){};
    }